

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_osd_decode.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char **val;
  string_t *__return_storage_ptr__;
  value_t vVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  reference pvVar8;
  object_t *poVar9;
  mod2sparse *H;
  char *pcVar10;
  json_value jVar11;
  char *decoding;
  int bit_no;
  int bp_method_00;
  json_value jVar12;
  ulong uVar13;
  double dVar14;
  double __val;
  long local_2118;
  json output;
  json json_input;
  long local_20e8;
  long local_20e0;
  mod2sparse *local_20d8;
  mod2sparse *local_20d0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_20b8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_20a8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2098;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2088;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2078;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2068;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2058;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2048;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2038;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2028;
  double local_2018;
  double dStack_2010;
  json_value local_2000;
  char *local_1ff8;
  number_float_t local_1ff0;
  number_float_t local_1fe8;
  string osd_method;
  string logical_check_method;
  string bp_method;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1f70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1f60;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1f50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1f40;
  string local_1f30;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1f10;
  string local_1f00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1ee0;
  undefined1 local_1ed0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1eb0;
  undefined1 local_1ea0 [32];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e40;
  undefined1 local_1e30 [16];
  string_t local_1e20;
  string p_label;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1de0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1dd0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1dc0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1db0;
  bp_osd hx_bp_osd;
  string local_1d28 [32];
  string local_1d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ce8;
  string local_1cc8 [32];
  string local_1ca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c88;
  string local_1c68 [32];
  string local_1c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c28;
  string label;
  string local_1be8 [32];
  string local_1bc8;
  string local_1ba8 [32];
  string local_1b88;
  string local_1b68 [32];
  string local_1b48;
  string local_1b28 [32];
  string local_1b08;
  string local_1ae8 [32];
  string local_1ac8;
  string local_1aa8 [32];
  string local_1a88;
  string local_1a68 [32];
  string local_1a48;
  string local_1a28 [32];
  string local_1a08;
  ofstream output_file;
  undefined7 uStack_19e7;
  timing time;
  stringstream output_filename;
  ostream local_1738 [376];
  ifstream json_input_file;
  MTRand r;
  
  if (argv[1] == (char *)0x0) {
    pcVar10 = "ERROR: Please provide a location for the input directory";
  }
  else {
    if (argv[2] != (char *)0x0) {
      val = argv + 1;
      timing::timing(&time);
      poVar7 = std::operator<<((ostream *)&std::cout,"Start time: ");
      poVar7 = std::operator<<(poVar7,time.start_time_string);
      std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::operator<<((ostream *)&std::cout,"Input file: ");
      poVar7 = std::operator<<(poVar7,*val);
      std::endl<char,std::char_traits<char>>(poVar7);
      dVar14 = timing::elapsed_time_seconds(&time);
      std::ifstream::ifstream((istream *)&json_input_file,*val,_S_in);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(&json_input,(nullptr_t)0x0);
      nlohmann::operator>>((istream *)&json_input_file,&json_input);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::dump((string_t *)&r,&json_input,1,' ',false,strict);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&r);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::__cxx11::string::~string((string *)&r);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(&output,&json_input);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<char_*&,_char_*,_0>(&local_1db0,val);
      pvVar8 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&output,"input_file");
      vVar1 = pvVar8->m_type;
      pvVar8->m_type = local_1db0.m_type;
      jVar11 = pvVar8->m_value;
      pvVar8->m_value = local_1db0.m_value;
      local_1db0.m_type = vVar1;
      local_1db0.m_value = jVar11;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_1db0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_1e30,&output);
      std::__cxx11::string::string((string *)&local_1a08,"input_seed",(allocator *)&output_file);
      std::__cxx11::string::string(local_1a28,"0",(allocator *)&output_filename);
      json_read_safe((json *)&r,(string *)local_1e30,&local_1a08);
      iVar5 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::get<int,_int,_0>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)&r);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&r);
      std::__cxx11::string::~string(local_1a28);
      std::__cxx11::string::~string((string *)&local_1a08);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_1e30);
      setup_mtwister_rng(&r,(long)iVar5);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<char_*&,_char_*,_0>(&local_1dc0,&time.start_time_string);
      pvVar8 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&output,"start_time");
      vVar1 = pvVar8->m_type;
      pvVar8->m_type = local_1dc0.m_type;
      jVar11 = pvVar8->m_value;
      pvVar8->m_value = local_1dc0.m_value;
      local_1dc0.m_type = vVar1;
      local_1dc0.m_value = jVar11;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_1dc0);
      local_1e40._8_8_ = (long)time.start_time_seconds + (long)iVar5;
      local_1e40._M_local_buf[0] = number_unsigned;
      pvVar8 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&output,"ui");
      vVar1 = pvVar8->m_type;
      pvVar8->m_type = local_1e40._M_local_buf[0];
      jVar11 = pvVar8->m_value;
      (pvVar8->m_value).object = (object_t *)local_1e40._8_8_;
      local_1e40._M_local_buf[0] = vVar1;
      local_1e40._8_8_ = jVar11;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&local_1e40);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)(local_1e60 + 0x10),&json_input);
      std::__cxx11::string::string
                ((string *)&local_1a48,"bit_error_rate",(allocator *)&output_filename);
      std::__cxx11::string::string(local_1a68,"0",(allocator *)&hx_bp_osd);
      json_read_safe((json *)&output_file,(string *)(local_1e60 + 0x10),&local_1a48);
      __val = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::get<double,_double,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)&output_file);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&output_file);
      std::__cxx11::string::~string(local_1a68);
      std::__cxx11::string::~string((string *)&local_1a48);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)(local_1e60 + 0x10));
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_1e60,&json_input);
      std::__cxx11::string::string((string *)&local_1a88,"osd_order",(allocator *)&output_filename);
      std::__cxx11::string::string(local_1aa8,"0",(allocator *)&hx_bp_osd);
      json_read_safe((json *)&output_file,(string *)local_1e60,&local_1a88);
      iVar5 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::get<int,_int,_0>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)&output_file);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&output_file);
      std::__cxx11::string::~string(local_1aa8);
      std::__cxx11::string::~string((string *)&local_1a88);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_1e60);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)(local_1e80 + 0x10),&json_input);
      std::__cxx11::string::string((string *)&local_1ac8,"max_iter",(allocator *)&output_filename);
      std::__cxx11::string::string(local_1ae8,"0",(allocator *)&hx_bp_osd);
      json_read_safe((json *)&output_file,(string *)(local_1e80 + 0x10),&local_1ac8);
      iVar6 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::get<int,_int,_0>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)&output_file);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&output_file);
      std::__cxx11::string::~string(local_1ae8);
      std::__cxx11::string::~string((string *)&local_1ac8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)(local_1e80 + 0x10));
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_1e80,&json_input);
      std::__cxx11::string::string
                ((string *)&local_1b08,"target_runs",(allocator *)&output_filename);
      std::__cxx11::string::string(local_1b28,"0",(allocator *)&hx_bp_osd);
      json_read_safe((json *)&output_file,(string *)local_1e80,&local_1b08);
      poVar9 = (object_t *)
               nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::get<unsigned_long_long,_unsigned_long_long,_0>
                         ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)&output_file);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&output_file);
      std::__cxx11::string::~string(local_1b28);
      std::__cxx11::string::~string((string *)&local_1b08);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_1e80);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)(local_1ea0 + 0x10),&json_input);
      std::__cxx11::string::string
                ((string *)&local_1b48,"logical_check_method",(allocator *)&output_filename);
      std::__cxx11::string::string(local_1b68,"lx",(allocator *)&hx_bp_osd);
      json_read_safe((json *)&output_file,(string *)(local_1ea0 + 0x10),&local_1b48);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&logical_check_method,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&output_file);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&output_file);
      std::__cxx11::string::~string(local_1b68);
      std::__cxx11::string::~string((string *)&local_1b48);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)(local_1ea0 + 0x10));
      bVar4 = std::operator==(&logical_check_method,"lx");
      if ((bVar4) || (bVar4 = std::operator==(&logical_check_method,"hz"), bVar4)) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_1ea0,&json_input);
        std::__cxx11::string::string
                  ((string *)&local_1b88,"osd_method",(allocator *)&output_filename);
        std::__cxx11::string::string(local_1ba8,"0",(allocator *)&hx_bp_osd);
        json_read_safe((json *)&output_file,(string *)local_1ea0,&local_1b88);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&osd_method,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&output_file);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)&output_file);
        std::__cxx11::string::~string(local_1ba8);
        std::__cxx11::string::~string((string *)&local_1b88);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_1ea0);
        bVar4 = std::operator==(&osd_method,"exhaustive");
        local_2118._0_4_ = 0;
        if ((!bVar4) && (bVar4 = std::operator==(&osd_method,"osd_e"), !bVar4)) {
          bVar4 = std::operator==(&osd_method,"combination_sweep");
          if (bVar4) {
            local_2118._0_4_ = 1;
          }
          else {
            bVar4 = std::operator==(&osd_method,"osd_cs");
            local_2118._0_4_ = 1;
            if (!bVar4) {
              bVar4 = std::operator==(&osd_method,"osd_0");
              if (bVar4) {
                local_1eb0._M_local_buf[0] = number_integer;
                local_1eb0._8_8_ = (object_t *)0x0;
                pvVar8 = nlohmann::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         ::operator[]<char_const>
                                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                     *)&output,"osd_order");
                local_2118._0_4_ = 2;
                vVar1 = pvVar8->m_type;
                pvVar8->m_type = local_1eb0._M_local_buf[0];
                jVar11 = pvVar8->m_value;
                (pvVar8->m_value).object = (object_t *)local_1eb0._8_8_;
                local_1eb0._M_local_buf[0] = vVar1;
                local_1eb0._8_8_ = jVar11;
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                               *)&local_1eb0);
              }
              else {
                bVar4 = std::operator==(&osd_method,"osd_g");
                if (!bVar4) {
                  poVar7 = std::operator<<((ostream *)&std::cout,"ERROR: Invalid OSD method: ");
                  poVar7 = std::operator<<(poVar7,(string *)&osd_method);
                  std::endl<char,std::char_traits<char>>(poVar7);
                  goto LAB_001191f5;
                }
                local_2118._0_4_ = 3;
              }
            }
          }
        }
        if (iVar5 == 0) {
          std::__cxx11::string::assign((char *)&osd_method);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_1dd0,&osd_method);
          pvVar8 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)&output,"osd_method");
          vVar1 = pvVar8->m_type;
          pvVar8->m_type = local_1dd0.m_type;
          jVar11 = pvVar8->m_value;
          pvVar8->m_value = local_1dd0.m_value;
          local_1dd0.m_type = vVar1;
          local_1dd0.m_value = jVar11;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json(&local_1dd0);
          local_2118._0_4_ = 2;
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)(local_1ed0 + 0x10),&json_input);
        std::__cxx11::string::string
                  ((string *)&local_1bc8,"bp_method",(allocator *)&output_filename);
        std::__cxx11::string::string(local_1be8,"min_sum",(allocator *)&hx_bp_osd);
        json_read_safe((json *)&output_file,(string *)(local_1ed0 + 0x10),&local_1bc8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&bp_method,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&output_file);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)&output_file);
        std::__cxx11::string::~string(local_1be8);
        std::__cxx11::string::~string((string *)&local_1bc8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)(local_1ed0 + 0x10));
        bVar4 = std::operator==(&bp_method,"min_sum");
        bp_method_00 = 0;
        if (!bVar4) {
          bVar4 = std::operator==(&bp_method,"min_sum_min_synd");
          if (bVar4) {
            bp_method_00 = 1;
          }
          else {
            bVar4 = std::operator==(&bp_method,"product_sum");
            if (bVar4) {
              bp_method_00 = 2;
            }
            else {
              bVar4 = std::operator==(&bp_method,"product_sum_min_synd");
              if (!bVar4) {
                poVar7 = std::operator<<((ostream *)&std::cout,"ERROR: Invalid BP method: ");
                poVar7 = std::operator<<(poVar7,(string *)&bp_method);
                std::endl<char,std::char_traits<char>>(poVar7);
                goto LAB_001191f5;
              }
              bp_method_00 = 3;
            }
          }
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_1de0,&bp_method);
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)&output,"bp_method");
        vVar1 = pvVar8->m_type;
        pvVar8->m_type = local_1de0.m_type;
        jVar11 = pvVar8->m_value;
        pvVar8->m_value = local_1de0.m_value;
        local_1de0.m_type = vVar1;
        local_1de0.m_value = jVar11;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&local_1de0);
        std::__cxx11::to_string(&p_label,__val);
        _output_file = (char *)CONCAT71(uStack_19e7,0x2e);
        output_filename = (stringstream)0x5f;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )p_label._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(p_label._M_dataplus._M_p + p_label._M_string_length),(char *)&output_file,
                   (char *)&output_filename);
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)&output,"code_label");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&label,pvVar8);
        std::__cxx11::stringstream::stringstream((stringstream *)&output_filename);
        poVar7 = std::operator<<(local_1738,argv[2]);
        poVar7 = std::operator<<(poVar7,"/");
        poVar7 = std::operator<<(poVar7,(string *)&label);
        poVar7 = std::operator<<(poVar7,";p:");
        poVar7 = std::operator<<(poVar7,(string *)&p_label);
        poVar7 = std::operator<<(poVar7,";ui:");
        poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar7);
        std::operator<<(poVar7,".json");
        poVar7 = std::operator<<((ostream *)&std::cout,"\nOutput filename: ");
        std::__cxx11::stringbuf::str();
        poVar7 = std::operator<<(poVar7,(string *)&output_file);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)&output_file);
        poVar7 = std::operator<<((ostream *)&std::cout,"\nLoading alist files");
        std::endl<char,std::char_traits<char>>(poVar7);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_1ed0,&json_input);
        std::__cxx11::string::string((string *)&local_1c48,"hx_filename",(allocator *)&hx_bp_osd);
        std::__cxx11::string::string(local_1c68,"0",(allocator *)(local_1e30 + 0x10));
        json_read_safe((json *)&output_file,(string *)local_1ed0,&local_1c48);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_1c28,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&output_file);
        H = load_alist_cpp(&local_1c28);
        std::__cxx11::string::~string((string *)&local_1c28);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)&output_file);
        std::__cxx11::string::~string(local_1c68);
        std::__cxx11::string::~string((string *)&local_1c48);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_1ed0);
        uVar13 = (ulong)H->n_rows;
        uVar2 = H->n_cols;
        jVar12 = (json_value)(long)(int)uVar2;
        local_1ee0.m_type = number_integer;
        local_1ee0.m_value = jVar12;
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)&output,"hx_n");
        vVar1 = pvVar8->m_type;
        pvVar8->m_type = local_1ee0.m_type;
        jVar11 = pvVar8->m_value;
        (pvVar8->m_value).number_unsigned = (number_unsigned_t)local_1ee0.m_value;
        local_1ee0.m_type = vVar1;
        local_1ee0.m_value = jVar11;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&local_1ee0);
        local_1f00.field_2._M_local_buf[0] = number_integer;
        local_1f00.field_2._8_8_ = uVar13;
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)&output,"hx_m");
        vVar1 = pvVar8->m_type;
        pvVar8->m_type = local_1f00.field_2._M_local_buf[0];
        jVar11 = pvVar8->m_value;
        (pvVar8->m_value).number_unsigned = local_1f00.field_2._8_8_;
        local_1f00.field_2._M_local_buf[0] = vVar1;
        local_1f00.field_2._8_8_ = jVar11;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)&local_1f00.field_2);
        bVar4 = std::operator==(&logical_check_method,"lx");
        if (bVar4) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&local_1f00,&json_input);
          std::__cxx11::string::string((string *)&local_1ca8,"lx_filename",(allocator *)&hx_bp_osd);
          std::__cxx11::string::string(local_1cc8,"0",(allocator *)(local_1e30 + 0x10));
          json_read_safe((json *)&output_file,&local_1f00,&local_1ca8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_1c88,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)&output_file);
          local_20d0 = load_alist_cpp(&local_1c88);
          std::__cxx11::string::~string((string *)&local_1c88);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)&output_file);
          std::__cxx11::string::~string(local_1cc8);
          std::__cxx11::string::~string((string *)&local_1ca8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)&local_1f00);
          iVar3 = local_20d0->n_rows;
          local_1f10.m_value = (json_value)(long)local_20d0->n_cols;
          local_1f10.m_type = number_integer;
          pvVar8 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)&output,"lx_n");
          vVar1 = pvVar8->m_type;
          pvVar8->m_type = local_1f10.m_type;
          jVar11 = pvVar8->m_value;
          pvVar8->m_value = local_1f10.m_value;
          local_1f10.m_type = vVar1;
          local_1f10.m_value = jVar11;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json(&local_1f10);
          local_1f30.field_2._M_local_buf[0] = number_integer;
          local_1f30.field_2._8_8_ = (long)iVar3;
          pvVar8 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)&output,"lx_k");
          vVar1 = pvVar8->m_type;
          pvVar8->m_type = local_1f30.field_2._M_local_buf[0];
          jVar11 = pvVar8->m_value;
          pvVar8->m_value = (json_value)local_1f30.field_2._8_8_;
          local_1f30.field_2._M_local_buf[0] = vVar1;
          local_1f30.field_2._8_8_ = jVar11;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)&local_1f30.field_2);
        }
        bVar4 = std::operator==(&logical_check_method,"hz");
        if (bVar4) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&local_1f30,&json_input);
          std::__cxx11::string::string((string *)&local_1d08,"hz_filename",(allocator *)&hx_bp_osd);
          std::__cxx11::string::string(local_1d28,"0",(allocator *)(local_1e30 + 0x10));
          json_read_safe((json *)&output_file,&local_1f30,&local_1d08);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_1ce8,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)&output_file);
          local_20d8 = load_alist_cpp(&local_1ce8);
          std::__cxx11::string::~string((string *)&local_1ce8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)&output_file);
          std::__cxx11::string::~string(local_1d28);
          std::__cxx11::string::~string((string *)&local_1d08);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)&local_1f30);
          iVar3 = local_20d8->n_rows;
          local_1f40.m_value = (json_value)(long)local_20d8->n_cols;
          local_1f40.m_type = number_integer;
          pvVar8 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)&output,"hz_n");
          vVar1 = pvVar8->m_type;
          pvVar8->m_type = local_1f40.m_type;
          jVar11 = pvVar8->m_value;
          pvVar8->m_value = local_1f40.m_value;
          local_1f40.m_type = vVar1;
          local_1f40.m_value = jVar11;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json(&local_1f40);
          local_1f50.m_type = number_integer;
          local_1f50.m_value = (json_value)(long)iVar3;
          pvVar8 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)&output,"hz_m");
          vVar1 = pvVar8->m_type;
          pvVar8->m_type = local_1f50.m_type;
          jVar11 = pvVar8->m_value;
          pvVar8->m_value = local_1f50.m_value;
          local_1f50.m_type = vVar1;
          local_1f50.m_value = jVar11;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json(&local_1f50);
        }
        bp_osd::bp_osd(&hx_bp_osd,H,__val,iVar6,(double)iVar5,(int)local_2118,bp_method_00);
        local_1f60.m_value = (json_value)(long)hx_bp_osd.max_iter;
        local_1f60.m_type = number_integer;
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)&output,"max_iter");
        vVar1 = pvVar8->m_type;
        pvVar8->m_type = local_1f60.m_type;
        jVar11 = pvVar8->m_value;
        pvVar8->m_value = local_1f60.m_value;
        local_1f60.m_type = vVar1;
        local_1f60.m_value = jVar11;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&local_1f60);
        local_1f70.m_type = number_unsigned;
        local_1f70.m_value.number_unsigned = hx_bp_osd.encoding_input_count;
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)&output,"osdw_encoding_operator_count");
        vVar1 = pvVar8->m_type;
        pvVar8->m_type = local_1f70.m_type;
        jVar11 = pvVar8->m_value;
        (pvVar8->m_value).number_unsigned = (number_unsigned_t)local_1f70.m_value;
        local_1f70.m_type = vVar1;
        local_1f70.m_value = jVar11;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&local_1f70);
        pcVar10 = (char *)operator_new__(jVar12.number_unsigned);
        memset(pcVar10,0,jVar12.number_unsigned);
        local_1ff8 = (char *)operator_new__(uVar13);
        memset(local_1ff8,0,uVar13);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar7 = std::operator<<((ostream *)&std::cout,"Simulating ");
        poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar7);
        poVar7 = std::operator<<(poVar7," error correction cycles...");
        std::endl<char,std::char_traits<char>>(poVar7);
        iVar5 = (int)dVar14;
        local_2118 = 0;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        local_20e8 = 0;
        local_20e0 = 0;
        local_2000.object = (object_t *)0x0;
        for (jVar11.number_integer = 1; jVar11.object <= poVar9;
            jVar11.object = (object_t *)&((jVar11.object)->_M_t)._M_impl.field_0x1) {
          bVar4 = true;
          for (uVar13 = 0; uVar2 != uVar13; uVar13 = uVar13 + 1) {
            dVar14 = genRand(&r);
            pcVar10[uVar13] = dVar14 < __val;
            bVar4 = (bool)(bVar4 & __val <= dVar14);
          }
          if (bVar4) {
            local_20e0 = local_20e0 + 1;
            local_20e8 = local_20e8 + 1;
            local_2118 = local_2118 + 1;
          }
          else {
            syndrome(H,pcVar10,local_1ff8);
            decoding = bp_osd::bp_osd_decode(&hx_bp_osd,local_1ff8);
            bVar4 = std::operator==(&logical_check_method,"lx");
            if (bVar4) {
              iVar6 = check_logical_error_lx(local_20d0,pcVar10,decoding);
            }
            else {
              iVar6 = check_logical_error_hz(local_20d8,pcVar10,decoding);
            }
            local_2118 = local_2118 + (ulong)(iVar6 == 0);
            bVar4 = std::operator==(&logical_check_method,"lx");
            if (bVar4) {
              iVar6 = check_logical_error_lx(local_20d0,pcVar10,hx_bp_osd.osd0_decoding);
            }
            else {
              iVar6 = check_logical_error_hz(local_20d8,pcVar10,hx_bp_osd.osd0_decoding);
            }
            local_20e8 = local_20e8 + (ulong)(iVar6 == 0);
            if (*hx_bp_osd.converge == 1) {
              bVar4 = std::operator==(&logical_check_method,"lx");
              if (bVar4) {
                iVar6 = check_logical_error_lx(local_20d0,pcVar10,hx_bp_osd.bp_decoding);
              }
              else {
                iVar6 = check_logical_error_hz(local_20d8,pcVar10,hx_bp_osd.bp_decoding);
              }
              local_2000.object = (object_t *)&((local_2000.object)->_M_t)._M_impl.field_0x1;
              local_20e0 = local_20e0 + (ulong)(iVar6 == 0);
            }
          }
          dVar14 = timing::elapsed_time_seconds(&time);
          if ((jVar11.object == poVar9) || (3.0 < dVar14 - (double)iVar5)) {
            dVar14 = timing::elapsed_time_seconds(&time);
            local_2038.m_type = number_unsigned;
            local_2038.m_value = jVar11;
            pvVar8 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)&output,"run_count");
            vVar1 = pvVar8->m_type;
            pvVar8->m_type = local_2038.m_type;
            jVar12 = pvVar8->m_value;
            (pvVar8->m_value).number_unsigned = (number_unsigned_t)local_2038.m_value;
            local_2038.m_type = vVar1;
            local_2038.m_value = jVar12;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&local_2038);
            local_2048.m_type = number_unsigned;
            local_2048.m_value.number_integer = local_2118;
            pvVar8 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)&output,"osdw_success_count");
            vVar1 = pvVar8->m_type;
            pvVar8->m_type = local_2048.m_type;
            jVar12 = pvVar8->m_value;
            (pvVar8->m_value).number_integer = (number_integer_t)local_2048.m_value;
            local_2048.m_type = vVar1;
            local_2048.m_value = jVar12;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&local_2048);
            local_2058.m_type = number_unsigned;
            local_2058.m_value.number_integer = local_20e8;
            pvVar8 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)&output,"osd0_success_count");
            vVar1 = pvVar8->m_type;
            pvVar8->m_type = local_2058.m_type;
            jVar12 = pvVar8->m_value;
            (pvVar8->m_value).number_integer = (number_integer_t)local_2058.m_value;
            local_2058.m_type = vVar1;
            local_2058.m_value = jVar12;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&local_2058);
            local_2068.m_type = number_unsigned;
            local_2068.m_value.number_integer = local_20e0;
            pvVar8 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)&output,"bp_success_count");
            vVar1 = pvVar8->m_type;
            pvVar8->m_type = local_2068.m_type;
            jVar12 = pvVar8->m_value;
            (pvVar8->m_value).number_integer = (number_integer_t)local_2068.m_value;
            local_2068.m_type = vVar1;
            local_2068.m_value = jVar12;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&local_2068);
            local_2078.m_type = number_unsigned;
            local_2078.m_value = local_2000;
            pvVar8 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)&output,"bp_converge_count");
            dStack_2010 = (double)CONCAT44(0x45300000,(int)((ulong)jVar11 >> 0x20)) -
                          1.9342813113834067e+25;
            local_2018 = dStack_2010 +
                         ((double)CONCAT44(0x43300000,(int)jVar11.number_integer) -
                         4503599627370496.0);
            local_1fe8 = 1.0 - (((double)CONCAT44(0x45300000,(int)((ulong)local_2118 >> 0x20)) -
                                1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)local_2118) - 4503599627370496.0))
                               / local_2018;
            vVar1 = pvVar8->m_type;
            pvVar8->m_type = local_2078.m_type;
            jVar12 = pvVar8->m_value;
            pvVar8->m_value = local_2078.m_value;
            local_2078.m_type = vVar1;
            local_2078.m_value = jVar12;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&local_2078);
            local_2088.m_type = number_float;
            local_2088.m_value.number_float = local_1fe8;
            pvVar8 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)&output,"osdw_ler");
            local_1ff0 = 1.0 - (((double)CONCAT44(0x45300000,(int)((ulong)local_20e8 >> 0x20)) -
                                1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)local_20e8) - 4503599627370496.0))
                               / local_2018;
            vVar1 = pvVar8->m_type;
            pvVar8->m_type = local_2088.m_type;
            jVar12 = pvVar8->m_value;
            (pvVar8->m_value).number_float = (number_float_t)local_2088.m_value;
            local_2088.m_type = vVar1;
            local_2088.m_value = jVar12;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&local_2088);
            local_2098.m_type = number_float;
            local_2098.m_value.number_float = local_1ff0;
            pvVar8 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)&output,"osd0_ler");
            local_2018 = 1.0 - (((double)CONCAT44(0x45300000,(int)((ulong)local_20e0 >> 0x20)) -
                                1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)local_20e0) - 4503599627370496.0))
                               / local_2018;
            vVar1 = pvVar8->m_type;
            pvVar8->m_type = local_2098.m_type;
            jVar12 = pvVar8->m_value;
            (pvVar8->m_value).number_float = (number_float_t)local_2098.m_value;
            local_2098.m_type = vVar1;
            local_2098.m_value = jVar12;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&local_2098);
            local_20a8.m_type = number_float;
            local_20a8.m_value.number_float = local_2018;
            pvVar8 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)&output,"bp_ler");
            vVar1 = pvVar8->m_type;
            pvVar8->m_type = local_20a8.m_type;
            jVar12 = pvVar8->m_value;
            (pvVar8->m_value).number_float = (number_float_t)local_20a8.m_value;
            local_20a8.m_type = vVar1;
            local_20a8.m_value = jVar12;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&local_20a8);
            local_20b8.m_value.number_float = timing::elapsed_time_seconds(&time);
            local_20b8.m_type = number_float;
            pvVar8 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)&output,"runtime_seconds");
            vVar1 = pvVar8->m_type;
            pvVar8->m_type = local_20b8.m_type;
            jVar12 = pvVar8->m_value;
            (pvVar8->m_value).number_float = (number_float_t)local_20b8.m_value;
            local_20b8.m_type = vVar1;
            local_20b8.m_value = jVar12;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&local_20b8);
            _output_file = timing::elapsed_time_readable(&time);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::basic_json<char_*,_char_*,_0>(&local_2028,(char **)&output_file);
            pvVar8 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)&output,"runtime_readable");
            vVar1 = pvVar8->m_type;
            pvVar8->m_type = local_2028.m_type;
            jVar12 = pvVar8->m_value;
            pvVar8->m_value = local_2028.m_value;
            local_2028.m_type = vVar1;
            local_2028.m_value = jVar12;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&local_2028);
            poVar7 = std::operator<<((ostream *)&std::cout,"Runs: ");
            poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar7);
            std::operator<<(poVar7,"; OSDW_LER: ");
            poVar7 = std::ostream::_M_insert<double>(local_1fe8);
            std::operator<<(poVar7,"; OSD0_LER: ");
            poVar7 = std::ostream::_M_insert<double>(local_1ff0);
            std::operator<<(poVar7,"; BP_LER: ");
            poVar7 = std::ostream::_M_insert<double>(local_2018);
            poVar7 = std::operator<<(poVar7,"; Runtime: ");
            pvVar8 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)&output,"runtime_readable");
            poVar7 = nlohmann::operator<<(poVar7,pvVar8);
            std::endl<char,std::char_traits<char>>(poVar7);
            __return_storage_ptr__ = (string_t *)(local_1e30 + 0x10);
            std::__cxx11::stringbuf::str();
            std::ofstream::ofstream(&output_file,(string *)__return_storage_ptr__,_S_trunc);
            std::__cxx11::string::~string((string *)__return_storage_ptr__);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::dump(__return_storage_ptr__,&output,1,' ',false,strict);
            std::operator<<((ostream *)&output_file,(string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)__return_storage_ptr__);
            std::ofstream::close();
            iVar5 = (int)dVar14;
            std::ofstream::~ofstream((ostream *)&output_file);
          }
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&output_filename);
        std::__cxx11::string::~string((string *)&label);
        std::__cxx11::string::~string((string *)&p_label);
        std::__cxx11::string::~string((string *)&bp_method);
        std::__cxx11::string::~string((string *)&osd_method);
        std::__cxx11::string::~string((string *)&logical_check_method);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&output);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&json_input);
        std::ifstream::~ifstream(&json_input_file);
        return 0;
      }
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ERROR: Please select a valid method for verifying the recovered error. `lx\' or `hz\'."
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      goto LAB_001191f5;
    }
    pcVar10 = "ERROR: Please provide a location for the output directory";
  }
  poVar7 = std::operator<<((ostream *)&std::cout,pcVar10);
  std::endl<char,std::char_traits<char>>(poVar7);
LAB_001191f5:
  exit(0x16);
}

Assistant:

int main(int argc, char *argv[])
{

    if(argv[1]==nullptr){
        cout<<"ERROR: Please provide a location for the input directory"<<endl;
        exit(22);
    };

    if(argv[2]==nullptr){
        cout<<"ERROR: Please provide a location for the output directory"<<endl;
        exit(22);
    };

//    if(argv[3]==nullptr){
//        cout<<"ERROR: Please select a method for verifying the recovered error"<<endl;
//        exit(22);
//    } else if ( strcmp(argv[3],"-lx") != 0 && strcmp(argv[3],"-hz") != 0  ) {
//        cout<<"ERROR: Please select a valid method for verifying the recovered error"<<endl;
//        exit(22);
//    };

    //timing functions setup
    timing time;
    cout<<"Start time: "<<time.start_time_string<<endl;
    cout<<"Input file: "<<argv[1]<<endl;
    int elapsed_seconds;
    elapsed_seconds=time.elapsed_time_seconds();

    //read in json input file
    ifstream json_input_file(argv[1]);
    json json_input;
    json_input_file>>json_input;
    cout<<json_input.dump(1)<<endl;
    json output=json_input;

    //get input file from command line arguments
    output["input_file"]=argv[1];

    //setup random number generator
    int random_seed = json_read_safe(output,"input_seed");
    MTRand r=setup_mtwister_rng(random_seed);

    //save start time
    output["start_time"] = time.start_time_string;

    //generate UI from start time + random seed
    unsigned long long int ui =time.start_time_seconds+random_seed;
    output["ui"]=ui;

    //read in sim parameters
    double bit_error_rate=json_read_safe(json_input,"bit_error_rate");
    int osd_order = json_read_safe(json_input,"osd_order");
    int max_iter=json_read_safe(json_input,"max_iter");
    long long unsigned int target_runs=json_read_safe(json_input,"target_runs");

    //read in Logical check method
    string logical_check_method = json_read_safe(json_input,"logical_check_method","lx");
    if((logical_check_method=="lx")||(logical_check_method=="hz")) 1;
    else{
        cout<<"ERROR: Please select a valid method for verifying the recovered error. `lx' or `hz'."<<endl;
        exit(22);
    }

    //read in OSD method and check that it is valid
    string osd_method = json_read_safe(json_input,"osd_method");
    int osd_method_i=-1;
    if((osd_method=="exhaustive")||(osd_method=="osd_e")) osd_method_i=0;
    else if((osd_method=="combination_sweep")||(osd_method=="osd_cs")) osd_method_i=1;
    else if(osd_method=="osd_0"){
        osd_method_i=2;
        output["osd_order"]=0;
    }
    else if(osd_method=="osd_g") osd_method_i=3;
    else{
        cout<<"ERROR: Invalid OSD method: "<<osd_method<<endl;
        exit(22);
    }
    if(osd_order==0){
        osd_method="osd_0";
        output["osd_method"]=osd_method;
        osd_method_i=2;
    }

    //read in BP method and check that it is valid
    string bp_method = json_read_safe(json_input,"bp_method","min_sum");
    int bp_method_i=-1;
    if(bp_method=="min_sum") bp_method_i=0;
    else if(bp_method=="min_sum_min_synd") bp_method_i=1;
    else if(bp_method=="product_sum") bp_method_i=2;
    else if(bp_method=="product_sum_min_synd") bp_method_i=3;
    else{
        cout<<"ERROR: Invalid BP method: "<<bp_method<<endl;
        exit(22);
    }
    output["bp_method"]=bp_method;

    

    //set up output file
    string p_label =to_string(bit_error_rate);
    replace( p_label.begin(), p_label.end(), '.', '_');
    string label =output["code_label"];
    stringstream output_filename;
    output_filename<<argv[2]<<"/"<<label<<";p:"<<p_label<<";ui:"<<ui<<".json";
    cout<<"\nOutput filename: "<< output_filename.str() <<endl;


    //LOAD ALIST FILES
    cout<<"\nLoading alist files"<<endl;

    //load hx parity check matrix
    mod2sparse *hx=load_alist_cpp(json_read_safe(json_input,"hx_filename"));
    int hx_m=mod2sparse_rows(hx);
    int hx_n=mod2sparse_cols(hx);
    output["hx_n"]=hx_n;
    output["hx_m"]=hx_m;

    //load logical check matrix, lx
    mod2sparse *lx;
    if(logical_check_method=="lx") {
        lx = load_alist_cpp(json_read_safe(json_input, "lx_filename"));
        int lx_k = mod2sparse_rows(lx);
        int lx_n = mod2sparse_cols(lx);
        output["lx_n"] = lx_n;
        output["lx_k"] = lx_k;
        assert(lx_n == hx_n);
    }

    mod2sparse *hz;
    if(logical_check_method=="hz") {
        hz=load_alist_cpp(json_read_safe(json_input,"hz_filename"));
        int hz_m=mod2sparse_rows(hz);
        int hz_n=mod2sparse_cols(hz);
        output["hz_n"]=hz_n;
        output["hz_m"]=hz_m;
        assert(hz_n==hx_n);
    }


    //Setup BP+OSD decoder for hx
    bp_osd hx_bp_osd(hx,bit_error_rate,max_iter,osd_order,osd_method_i,bp_method_i);
    output["max_iter"]=hx_bp_osd.max_iter;
    output["osdw_encoding_operator_count"]=hx_bp_osd.encoding_input_count;


    //MEMORY ALLOCATION (we can do this now that we know the size of the matrices we are dealing with!)
    double *soft_decisions = new double[hx_n]();
    char *bit_error = new char[hx_n]();
    char *bp_decoding = new char[hx_n]();
    char *osd_decoding = new char[hx_n]();
    char *osdw_decoding = new char[hx_n]();
    char *bit_syndrome = new char[hx_m]();

    //declarations for various simulation variables
    long long unsigned int bp_converge_count=0;
    long long unsigned int bp_success_count=0;
    long long unsigned int osd0_success_count=0;
    long long unsigned int osdw_success_count=0;
    bool logical_error;
    bool zero_error;
    double osdw_ler;
    double osd0_ler;
    double bp_ler;



    //MAIN SIM LOOP

    cout<<endl;
    cout<<"Simulating "<<target_runs<<" error correction cycles..."<<endl;
    for(long long unsigned int run_count=1; run_count <= target_runs; run_count++) {

        //generate error
        zero_error=true;
        for (int bit_no = 0; bit_no < hx_n; bit_no++) {
            bit_error[bit_no] = genRand(&r) < bit_error_rate;
            if(bit_error[bit_no]==1) zero_error=false;
        }

        //Skip decoding if generated error is a zero vector.
        if(zero_error) {
            bp_success_count++;
            osd0_success_count++;
            osdw_success_count++;
        }
        else {
            //calculate syndrome
            syndrome(hx, bit_error, bit_syndrome);

            //decode
            osdw_decoding = hx_bp_osd.bp_osd_decode(bit_syndrome);


            //check for logical errors
            if (logical_check_method=="lx") {
                logical_error = check_logical_error_lx(lx, bit_error, osdw_decoding);
            } else {
                logical_error = check_logical_error_hz(hz, bit_error, osdw_decoding);
            }

            if (!logical_error) osdw_success_count++;
            
//            osdw_decoding = hx_bp_osd.osd0_decoding;
            if (logical_check_method=="lx") {
                logical_error = check_logical_error_lx(lx, bit_error, hx_bp_osd.osd0_decoding);
            } else {
                logical_error = check_logical_error_hz(hz, bit_error, hx_bp_osd.osd0_decoding);
            }
            
            if (!logical_error) osd0_success_count++;

            if (*hx_bp_osd.converge == 1) {
                bp_converge_count++;

                if (logical_check_method=="lx") {
                    logical_error = check_logical_error_lx(lx, bit_error, hx_bp_osd.bp_decoding);
                } else {
                    logical_error = check_logical_error_hz(hz, bit_error, hx_bp_osd.bp_decoding);
                }

                if (!logical_error) bp_success_count++;
            }
        }


        //write to output every 3 seconds. Change this as you see fit
        if((time.elapsed_time_seconds()-elapsed_seconds>3) | (run_count==target_runs) ){

            //calculate logical error rates
            osdw_ler= 1.0 - osdw_success_count / (double(run_count));
            osd0_ler= 1.0 - osd0_success_count / (double(run_count));
            bp_ler= 1.0 - bp_success_count / (double(run_count));

            elapsed_seconds=time.elapsed_time_seconds();

            output["run_count"] = run_count;
            output["osdw_success_count"]=osdw_success_count;
            output["osd0_success_count"]=osd0_success_count;
            output["bp_success_count"]=bp_success_count;
            output["bp_converge_count"]=bp_converge_count;
            output["osdw_ler"] = osdw_ler;
            output["osd0_ler"] = osd0_ler;
            output["bp_ler"] = bp_ler;
            output["runtime_seconds"] = time.elapsed_time_seconds();
            output["runtime_readable"] = time.elapsed_time_readable();
            cout << "Runs: " << run_count << "; OSDW_LER: " << osdw_ler << "; OSD0_LER: " << osd0_ler << "; BP_LER: " << bp_ler << "; Runtime: " << output["runtime_readable"] << endl;

            //command line output
            ofstream output_file(output_filename.str(),ofstream::trunc);
            output_file<<output.dump(1);
            output_file.close();

        }





    }



}